

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::fragment_index::key(fragment_index *this,string *s)

{
  undefined8 uVar1;
  maybe<pstore::uint128,_void> *pmVar2;
  uint128 *puVar3;
  error_category *extraout_RDX;
  error_code eVar4;
  maybe<pstore::uint128,_void> digest;
  
  pmVar2 = uint128::from_hex_string(&digest,s);
  eVar4._M_cat = extraout_RDX;
  eVar4._0_8_ = pmVar2;
  if (digest.valid_ == true) {
    puVar3 = maybe<pstore::uint128,_void>::operator->(&digest);
    uVar1 = *(undefined8 *)((long)&puVar3->v_ + 8);
    *(long *)&(this->digest_).v_ = (long)puVar3->v_;
    *(undefined8 *)((long)&(this->digest_).v_ + 8) = uVar1;
    eVar4 = rule::
            push<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>
                      (&this->super_rule,(this->transaction_).ptr_,(this->names_).ptr_,
                       &this->digest_);
  }
  if (digest.valid_ == false) {
    eVar4 = make_error_code(bad_digest);
  }
  return eVar4;
}

Assistant:

std::error_code fragment_index::key (std::string const & s) {
                if (maybe<index::digest> const digest = uint128::from_hex_string (s)) {
                    digest_ = *digest;
                    return push_object_rule<fragment_sections> (this, transaction_, names_,
                                                                &digest_);
                }
                return error::bad_digest;
            }